

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QDockAreaLayout::plug(QDockAreaLayout *this,QList<int> *path)

{
  long lVar1;
  int *piVar2;
  QLayoutItem *pQVar3;
  QList<int> *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QLayoutItem *item;
  int index;
  QList<int> *in_stack_ffffffffffffffa0;
  QList<int> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = QList<int>::first(in_stack_ffffffffffffffa0);
  iVar4 = *piVar2;
  QList<int>::mid(in_RSI,CONCAT44(iVar4,in_stack_ffffffffffffffc8),
                  (qsizetype)in_stack_ffffffffffffffc0);
  pQVar3 = QDockAreaLayoutInfo::plug
                     ((QDockAreaLayoutInfo *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc0);
  QList<int>::~QList((QList<int> *)0x578711);
  QDockAreaLayoutInfo::reparentWidgets(in_stack_ffffffffffffffe0,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QDockAreaLayout::plug(const QList<int> &path)
{
#if QT_CONFIG(tabbar)
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);
    QLayoutItem *item = docks[index].plug(path.mid(1));
    docks[index].reparentWidgets(mainWindow);
    return item;
#else
    return nullptr;
#endif
}